

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.cpp
# Opt level: O3

bool __thiscall
test_quickhull<double,_std::forward_list<double,_std::allocator<double>_>,_std::forward_list<std::forward_list<double,_std::allocator<double>_>,_std::allocator<std::forward_list<double,_std::allocator<double>_>_>_>_>
::gnuplot::output(gnuplot *this,ostream *_out)

{
  point_list *ppVar1;
  point_list *ppVar2;
  size_type sVar3;
  _Elt_pointer pfVar4;
  pointer p_Var5;
  ostream *poVar6;
  long lVar7;
  const_iterator __end0;
  _Map_pointer ppfVar8;
  _Fwd_list_node_base *p_Var9;
  _Prime_rehash_policy *p_Var10;
  char *pcVar11;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *v;
  _Elt_pointer pfVar12;
  _List_node_base *p_Var13;
  gnuplot *pgVar14;
  facet *facet_;
  _Elt_pointer pfVar15;
  _List_node_base *p_Var16;
  _Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_> *vertex_;
  pointer p_Var17;
  undefined8 *puVar18;
  char local_73;
  char local_72;
  char local_71;
  char local_70;
  char local_6f;
  char local_6e;
  char local_6d;
  char local_6c;
  char local_6b;
  char local_6a;
  char local_69;
  gnuplot *local_68;
  _Elt_pointer local_60;
  _Map_pointer local_58;
  _Elt_pointer local_50;
  _Map_pointer local_48;
  ulong local_40;
  _Elt_pointer local_38;
  
  local_40 = (this->quick_hull_).dimension_;
  if (3 < local_40) {
    poVar6 = this->log_;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"dimensionality value ",0x15);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," is out of supported range: cannot generate output",0x32);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    goto LAB_0010fe7d;
  }
  if (this->f == true) {
    this->f = false;
    pcVar11 = 
    "set view equal xyz\nset autoscale\nset key left\nset xrange [] writeback\nset yrange [] writeback\nset zrange [] writeback\n"
    ;
    lVar7 = 0x76;
  }
  else {
    pcVar11 = "pause mouse\n\nclear\nset xrange restore\nset yrange restore\nset zrange restore\n";
    lVar7 = 0x4c;
  }
  std::__ostream_insert<char,std::char_traits<char>>(_out,pcVar11,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>(_out,"set title \'Points count is ",0x1b);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)_out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'\n",2);
  sVar3 = (this->quick_hull_).dimension_;
  if (sVar3 == 3) {
    pcVar11 = "splot";
    lVar7 = 5;
LAB_0010fa4f:
    std::__ostream_insert<char,std::char_traits<char>>(_out,pcVar11,lVar7);
  }
  else if (sVar3 == 2) {
    pcVar11 = "plot";
    lVar7 = 4;
    goto LAB_0010fa4f;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (_out,
             " \'-\' with points notitle pointtype 4 pointsize 1.5 linetype 1, \'-\' with points notitle, \'-\' with labels offset character 0, character 1 notitle"
             ,0x8f);
  pfVar15 = (this->quick_hull_).facets_.
            super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pfVar4 = (this->quick_hull_).facets_.
           super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_68 = this;
  if (pfVar15 != pfVar4) {
    pfVar12 = (this->quick_hull_).facets_.
              super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
              ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppfVar8 = (this->quick_hull_).facets_.
              super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(_out,", \'-\' with lines notitle",0x18);
      if ((pfVar15->coplanar_).
          super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
          (pfVar15->coplanar_).
          super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (_out,", \'-\' with points notitle pointtype 6 pointsize 1.5 linetype 4",0x3e);
      }
      pfVar15 = pfVar15 + 1;
      if (pfVar15 == pfVar12) {
        pfVar15 = ppfVar8[1];
        ppfVar8 = ppfVar8 + 1;
        pfVar12 = pfVar15 + 2;
      }
    } while (pfVar15 != pfVar4);
  }
  pgVar14 = local_68;
  ppVar1 = &local_68->universe_;
  std::__ostream_insert<char,std::char_traits<char>>(_out,";\n",2);
  ppVar2 = &pgVar14->initial_simplex_;
  p_Var16 = (pgVar14->initial_simplex_).
            super__List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)ppVar2) {
    do {
      for (p_Var13 = (p_Var16[1]._M_next)->_M_prev; p_Var13 != (_List_node_base *)0x0;
          p_Var13 = p_Var13->_M_next) {
        poVar6 = std::ostream::_M_insert<double>((double)p_Var13->_M_prev);
        local_72 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_72,1);
      }
      local_73 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(_out,&local_73,1);
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != (_List_node_base *)ppVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(_out,"e\n",2);
  p_Var16 = (ppVar1->
            super__List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)ppVar1) {
    do {
      for (p_Var13 = (p_Var16[1]._M_next)->_M_prev; p_Var13 != (_List_node_base *)0x0;
          p_Var13 = p_Var13->_M_next) {
        poVar6 = std::ostream::_M_insert<double>((double)p_Var13->_M_prev);
        local_70 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_70,1);
      }
      local_71 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(_out,&local_71,1);
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != (_List_node_base *)ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(_out,"e\n",2);
  p_Var16 = (ppVar1->
            super__List_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 != (_List_node_base *)ppVar1) {
    do {
      for (p_Var13 = (p_Var16[1]._M_next)->_M_prev; p_Var13 != (_List_node_base *)0x0;
          p_Var13 = p_Var13->_M_next) {
        poVar6 = std::ostream::_M_insert<double>((double)p_Var13->_M_prev);
        local_6e = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_6e,1);
      }
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)_out);
      local_6f = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_6f,1);
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != (_List_node_base *)ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(_out,"e\n",2);
  local_60 = (local_68->quick_hull_).facets_.
             super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_38 = (local_68->quick_hull_).facets_.
             super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (local_60 != local_38) {
    local_50 = (local_68->quick_hull_).facets_.
               super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
    local_58 = (local_68->quick_hull_).facets_.
               super__Deque_base<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      p_Var17 = (local_60->vertices_).
                super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var5 = (local_60->vertices_).
               super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var17 != p_Var5) {
        do {
          for (p_Var9 = p_Var17->_M_node[1]._M_next; p_Var9 != (_Fwd_list_node_base *)0x0;
              p_Var9 = p_Var9->_M_next) {
            poVar6 = std::ostream::_M_insert<double>((double)p_Var9[1]._M_next);
            local_6c = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_6c,1);
          }
          local_6d = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(_out,&local_6d,1);
          p_Var17 = p_Var17 + 1;
        } while (p_Var17 != p_Var5);
        p_Var17 = (local_60->vertices_).
                  super__Vector_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      for (p_Var9 = p_Var17->_M_node[1]._M_next; p_Var9 != (_Fwd_list_node_base *)0x0;
          p_Var9 = p_Var9->_M_next) {
        poVar6 = std::ostream::_M_insert<double>((double)p_Var9[1]._M_next);
        local_6b = ' ';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_6b,1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(_out,"\ne\n",3);
      pgVar14 = (gnuplot *)
                (local_60->coplanar_).
                super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_68 = (gnuplot *)
                 (local_60->coplanar_).
                 super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_68 != pgVar14) {
        p_Var10 = (_Prime_rehash_policy *)
                  (local_60->coplanar_).
                  super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_last;
        local_48 = (local_60->coplanar_).
                   super__Deque_base<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
        do {
          for (puVar18 = *(undefined8 **)(pgVar14->err_ + 8); puVar18 != (undefined8 *)0x0;
              puVar18 = (undefined8 *)*puVar18) {
            poVar6 = std::ostream::_M_insert<double>((double)puVar18[1]);
            local_69 = ' ';
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_69,1);
          }
          local_6a = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(_out,&local_6a,1);
          pgVar14 = (gnuplot *)&pgVar14->log_;
          if (pgVar14 == (gnuplot *)p_Var10) {
            pgVar14 = (gnuplot *)local_48[1];
            local_48 = local_48 + 1;
            p_Var10 = (_Prime_rehash_policy *)&(pgVar14->quick_hull_).visited_._M_h._M_element_count
            ;
          }
        } while (pgVar14 != local_68);
        std::__ostream_insert<char,std::char_traits<char>>(_out,"e\n",2);
      }
      local_60 = local_60 + 1;
      if (local_60 == local_50) {
        local_60 = local_58[1];
        local_58 = local_58 + 1;
        local_50 = local_60 + 2;
      }
    } while (local_60 != local_38);
  }
LAB_0010fe7d:
  return local_40 < 4;
}

Assistant:

bool
        output(std::ostream & _out) const
        {
            if (operator bool ()) {
                log_ << "dimensionality value " << quick_hull_.dimension_
                     << " is out of supported range: cannot generate output" << std::endl;
                return false;
            }
            if (f) {
                f = false;
                _out << "set view equal xyz\n"
                        "set autoscale\n"
                        "set key left\n"
                        "set xrange [] writeback\n"
                        "set yrange [] writeback\n"
                        "set zrange [] writeback\n";
            } else {
                _out << "pause mouse\n\n"
                        "clear\n"
                        "set xrange restore\n"
                        "set yrange restore\n"
                        "set zrange restore\n";
            }